

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void help(void)

{
  fprintf(_stderr,"-O [filename] Exceedance Probability Table (EPT)\n");
  fprintf(_stderr,"-o [filename] Per Sample Exceedance Probability Table (PSEPT)\n");
  fprintf(_stderr,"-P [filename] EPT output in parquet format\n");
  fprintf(_stderr,"-p [filename] PSEPT output in parquet format\n");
  fprintf(_stderr,"-F Aggregate Full Uncertainty\n");
  fprintf(_stderr,"-W Aggregate Wheatsheaf\n");
  fprintf(_stderr,"-S Aggregate Sample Mean\n");
  fprintf(_stderr,"-M Aggregate Wheatsheaf mean\n");
  fprintf(_stderr,"-f Occurrence Full Uncertainty\n");
  fprintf(_stderr,"-w Occurrence Wheatsheaf\n");
  fprintf(_stderr,"-s Occurrence Sample Mean\n");
  fprintf(_stderr,"-m Occurrence Wheatsheaf mean\n");
  fprintf(_stderr,"-K [directory] Workspace sub folder\n");
  fprintf(_stderr,"-r Use return period file\n");
  fprintf(_stderr,"-H Skip header\n");
  fprintf(_stderr,"-h help\n");
  fprintf(_stderr,"-v version\n");
  return;
}

Assistant:

void help()
{
	fprintf(stderr, "-O [filename] Exceedance Probability Table (EPT)\n");
	fprintf(stderr, "-o [filename] Per Sample Exceedance Probability Table (PSEPT)\n");
	fprintf(stderr, "-P [filename] EPT output in parquet format\n");
	fprintf(stderr, "-p [filename] PSEPT output in parquet format\n");
	fprintf(stderr, "-F Aggregate Full Uncertainty\n");
	fprintf(stderr, "-W Aggregate Wheatsheaf\n");
	fprintf(stderr, "-S Aggregate Sample Mean\n");
	fprintf(stderr, "-M Aggregate Wheatsheaf mean\n");
	fprintf(stderr, "-f Occurrence Full Uncertainty\n");
	fprintf(stderr, "-w Occurrence Wheatsheaf\n");
	fprintf(stderr, "-s Occurrence Sample Mean\n");
	fprintf(stderr, "-m Occurrence Wheatsheaf mean\n");
	fprintf(stderr, "-K [directory] Workspace sub folder\n");
	fprintf(stderr, "-r Use return period file\n");
	fprintf(stderr, "-H Skip header\n");
	fprintf(stderr, "-h help\n");
	fprintf(stderr, "-v version\n");
}